

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktQueryPoolOcclusionTests.cpp
# Opt level: O3

TestStatus * __thiscall
vkt::QueryPool::anon_unknown_0::OcclusionQueryTestInstance::iterate
          (TestStatus *__return_storage_ptr__,OcclusionQueryTestInstance *this)

{
  pointer *ppuVar1;
  void **ppvVar2;
  void **ppvVar3;
  deUint32 *pdVar4;
  OcclusionQueryWait OVar5;
  OcclusionQueryResultSize OVar6;
  VkPrimitiveTopology VVar7;
  TestLog *this_00;
  StateObjects *this_01;
  Allocation *pAVar8;
  VkSemaphore *__src;
  VkDeviceSize VVar9;
  TestLog *pTVar10;
  ulong uVar11;
  bool bVar12;
  VkResult VVar13;
  OcclusionQueryResultsMode OVar14;
  VkQueue pVVar15;
  DeviceInterface *vk;
  VkDevice device;
  DeviceInterface *vkd;
  TestError *pTVar16;
  ulong uVar17;
  long lVar18;
  deUint64 *pdVar19;
  deUint64 dVar20;
  int iVar21;
  ulong uVar22;
  vector<unsigned_char,_std::allocator<unsigned_char>_> resultsBuffer;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> local_230;
  string local_218;
  deUint64 queryResults [3];
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> local_1e0;
  VkSubmitInfo submitInfoReset;
  ios_base local_150 [264];
  deUint64 queryAvailability [3];
  
  pVVar15 = Context::getUniversalQueue((this->super_TestInstance).m_context);
  vk = Context::getDeviceInterface((this->super_TestInstance).m_context);
  this_00 = ((this->super_TestInstance).m_context)->m_testCtx->m_log;
  local_1e0.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)operator_new(0x90);
  local_1e0.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       local_1e0.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
       _M_impl.super__Vector_impl_data._M_start + 9;
  (local_1e0.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
   _M_impl.super__Vector_impl_data._M_start)->m_data[0] = 0.5;
  (local_1e0.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
   _M_impl.super__Vector_impl_data._M_start)->m_data[1] = 0.5;
  (local_1e0.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
   _M_impl.super__Vector_impl_data._M_start)->m_data[2] = 0.5;
  (local_1e0.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
   _M_impl.super__Vector_impl_data._M_start)->m_data[3] = 1.0;
  local_1e0.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_start[1].m_data[0] = 0.5;
  local_1e0.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_start[1].m_data[1] = -0.5;
  local_1e0.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_start[1].m_data[2] = 0.5;
  local_1e0.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_start[1].m_data[3] = 1.0;
  local_1e0.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_start[2].m_data[0] = -0.5;
  local_1e0.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_start[2].m_data[1] = 0.5;
  local_1e0.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_start[2].m_data[2] = 0.5;
  local_1e0.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_start[2].m_data[3] = 1.0;
  local_1e0.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_start[3].m_data[0] = -0.5;
  local_1e0.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_start[3].m_data[1] = -0.5;
  local_1e0.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_start[3].m_data[2] = 1.0;
  local_1e0.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_start[3].m_data[3] = 1.0;
  local_1e0.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_start[4].m_data[0] = 0.5;
  local_1e0.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_start[4].m_data[1] = -0.5;
  local_1e0.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_start[4].m_data[2] = 1.0;
  local_1e0.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_start[4].m_data[3] = 1.0;
  local_1e0.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_start[5].m_data[0] = -0.5;
  local_1e0.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_start[5].m_data[1] = 0.5;
  local_1e0.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_start[5].m_data[2] = 1.0;
  local_1e0.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_start[5].m_data[3] = 1.0;
  local_1e0.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_start[6].m_data[0] = 0.5;
  local_1e0.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_start[6].m_data[1] = 0.5;
  local_1e0.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_start[6].m_data[2] = 1.0;
  local_1e0.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_start[6].m_data[3] = 1.0;
  local_1e0.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_start[7].m_data[0] = 0.5;
  local_1e0.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_start[7].m_data[1] = -0.5;
  local_1e0.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_start[7].m_data[2] = 1.0;
  local_1e0.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_start[7].m_data[3] = 1.0;
  local_1e0.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_start[8].m_data[0] = -0.5;
  local_1e0.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_start[8].m_data[1] = 0.5;
  local_1e0.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_start[8].m_data[2] = 1.0;
  local_1e0.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_start[8].m_data[3] = 1.0;
  this_01 = this->m_stateObjects;
  local_1e0.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       local_1e0.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            (&local_230,&local_1e0);
  StateObjects::setVertices(this_01,vk,&local_230);
  if (local_230.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_230.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_230.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_230.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (((this->m_testVector).queryResultsMode != RESULTS_MODE_COPY) &&
     ((this->m_testVector).queryWait != WAIT_QUEUE)) {
    submitInfoReset.pNext = (void *)0x0;
    submitInfoReset.pWaitDstStageMask = (VkPipelineStageFlags *)0x0;
    submitInfoReset.signalSemaphoreCount = 0;
    submitInfoReset._60_4_ = 0;
    submitInfoReset.waitSemaphoreCount = 0;
    submitInfoReset._20_4_ = 0;
    submitInfoReset.pWaitSemaphores = (VkSemaphore *)0x0;
    submitInfoReset.pSignalSemaphores = (VkSemaphore *)0x0;
    submitInfoReset.sType = VK_STRUCTURE_TYPE_SUBMIT_INFO;
    submitInfoReset._4_4_ = 0;
    submitInfoReset.commandBufferCount = 1;
    submitInfoReset._44_4_ = 0;
    submitInfoReset.pCommandBuffers = (VkCommandBuffer *)&this->m_queryPoolResetCommandBuffer;
    (*vk->_vptr_DeviceInterface[2])(vk,pVVar15,1,&submitInfoReset,0);
    VVar13 = (*vk->_vptr_DeviceInterface[3])(vk,pVVar15);
    ::vk::checkResult(VVar13,"vk.queueWaitIdle(queue)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/query_pool/vktQueryPoolOcclusionTests.cpp"
                      ,0x292);
  }
  submitInfoReset.pNext = (void *)0x0;
  submitInfoReset.pWaitDstStageMask = (VkPipelineStageFlags *)0x0;
  submitInfoReset.signalSemaphoreCount = 0;
  submitInfoReset._60_4_ = 0;
  submitInfoReset.waitSemaphoreCount = 0;
  submitInfoReset._20_4_ = 0;
  submitInfoReset.pWaitSemaphores = (VkSemaphore *)0x0;
  submitInfoReset.pSignalSemaphores = (VkSemaphore *)0x0;
  submitInfoReset.sType = VK_STRUCTURE_TYPE_SUBMIT_INFO;
  submitInfoReset._4_4_ = 0;
  submitInfoReset.commandBufferCount = 1;
  submitInfoReset._44_4_ = 0;
  submitInfoReset.pCommandBuffers = (VkCommandBuffer *)&this->m_renderCommandBuffer;
  (*vk->_vptr_DeviceInterface[2])(vk,pVVar15,1,&submitInfoReset,0);
  if ((this->m_testVector).queryWait == WAIT_QUEUE) {
    VVar13 = (*vk->_vptr_DeviceInterface[3])(vk,pVVar15);
    ::vk::checkResult(VVar13,"vk.queueWaitIdle(queue)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/query_pool/vktQueryPoolOcclusionTests.cpp"
                      ,0x2a7);
    OVar14 = (this->m_testVector).queryResultsMode;
    if ((OVar14 != RESULTS_MODE_COPY) || ((this->m_testVector).queryWait != WAIT_QUEUE))
    goto LAB_006a428b;
    submitInfoReset.pNext = (void *)0x0;
    submitInfoReset.pWaitDstStageMask = (VkPipelineStageFlags *)0x0;
    submitInfoReset.signalSemaphoreCount = 0;
    submitInfoReset._60_4_ = 0;
    submitInfoReset.waitSemaphoreCount = 0;
    submitInfoReset._20_4_ = 0;
    submitInfoReset.pWaitSemaphores = (VkSemaphore *)0x0;
    submitInfoReset.pSignalSemaphores = (VkSemaphore *)0x0;
    submitInfoReset.sType = VK_STRUCTURE_TYPE_SUBMIT_INFO;
    submitInfoReset._4_4_ = 0;
    submitInfoReset.commandBufferCount = 1;
    submitInfoReset._44_4_ = 0;
    submitInfoReset.pCommandBuffers = (VkCommandBuffer *)&this->m_copyResultsCommandBuffer;
    (*vk->_vptr_DeviceInterface[2])(vk,pVVar15,1,&submitInfoReset,0);
  }
  OVar14 = (this->m_testVector).queryResultsMode;
LAB_006a428b:
  if (OVar14 == RESULTS_MODE_COPY) {
    VVar13 = (*vk->_vptr_DeviceInterface[3])(vk,pVVar15);
    ::vk::checkResult(VVar13,"vk.queueWaitIdle(queue)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/query_pool/vktQueryPoolOcclusionTests.cpp"
                      ,0x2c5);
  }
  OVar5 = (this->m_testVector).queryWait;
  device = Context::getDevice((this->super_TestInstance).m_context);
  vkd = Context::getDeviceInterface((this->super_TestInstance).m_context);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&resultsBuffer,(this->m_testVector).queryResultsStride * 3,
             (allocator_type *)&submitInfoReset);
  OVar14 = (this->m_testVector).queryResultsMode;
  if (OVar14 == RESULTS_MODE_COPY) {
    pAVar8 = (((this->m_queryPoolResultsBuffer).m_ptr)->m_allocation).
             super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
    submitInfoReset._0_8_ = &PTR__Allocation_00d1abf8;
    submitInfoReset.pNext = (void *)(pAVar8->m_memory).m_internal;
    submitInfoReset._16_8_ = pAVar8->m_offset;
    __src = (VkSemaphore *)pAVar8->m_hostPtr;
    submitInfoReset.pWaitSemaphores = __src;
    ::vk::invalidateMappedMemoryRange
              (vkd,device,(VkDeviceMemory)submitInfoReset.pNext,submitInfoReset._16_8_,
               (long)resultsBuffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)resultsBuffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                     ._M_impl.super__Vector_impl_data._M_start);
    memcpy(resultsBuffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start,__src,
           (long)resultsBuffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)resultsBuffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_start);
    ::vk::Allocation::~Allocation((Allocation *)&submitInfoReset);
  }
  else if (OVar14 == RESULTS_MODE_GET) {
    VVar13 = (*vkd->_vptr_DeviceInterface[0x20])
                       (vkd,device,(this->m_queryPool).m_internal,0,3,
                        (long)resultsBuffer.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)resultsBuffer.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                        resultsBuffer.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start,(this->m_testVector).queryResultsStride,
                        (ulong)this->m_queryResultFlags);
    if ((OVar5 != WAIT_NONE) && (VVar13 == VK_NOT_READY)) {
      pTVar16 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar16,
                 "getQueryPoolResults returned VK_NOT_READY, but results should be already available."
                 ,(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/query_pool/vktQueryPoolOcclusionTests.cpp"
                 ,0x373);
      __cxa_throw(pTVar16,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    ::vk::checkResult(VVar13,"queryResult",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/query_pool/vktQueryPoolOcclusionTests.cpp"
                      ,0x377);
  }
  OVar6 = (this->m_testVector).queryResultSize;
  if (RESULT_SIZE_32_BIT < OVar6) {
    pTVar16 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar16,"Wrong m_testVector.queryResultSize",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/query_pool/vktQueryPoolOcclusionTests.cpp"
               ,0x39f);
    __cxa_throw(pTVar16,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  bVar12 = (this->m_testVector).queryResultsAvailability;
  VVar9 = (this->m_testVector).queryResultsStride;
  lVar18 = 0;
  pdVar19 = (deUint64 *)
            resultsBuffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start;
  do {
    if (OVar6 == RESULT_SIZE_32_BIT) {
      queryResults[lVar18] = (ulong)(uint)*pdVar19;
      if ((bVar12 & 1U) != 0) {
        dVar20 = (deUint64)*(uint *)((long)pdVar19 + 4);
LAB_006a444b:
        queryAvailability[lVar18] = dVar20;
      }
    }
    else {
      queryResults[lVar18] = *pdVar19;
      if ((bVar12 & 1U) != 0) {
        dVar20 = pdVar19[1];
        goto LAB_006a444b;
      }
    }
    lVar18 = lVar18 + 1;
    pdVar19 = (deUint64 *)((long)pdVar19 + VVar9);
  } while (lVar18 != 3);
  ppuVar1 = &resultsBuffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
             .super__Vector_impl_data._M_end_of_storage;
  operator_delete(resultsBuffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start,
                  (long)resultsBuffer.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage -
                  (long)resultsBuffer.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
  resultsBuffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)ppuVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&resultsBuffer,"OcclusionQueryResults","");
  local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"Occlusion query results","")
  ;
  tcu::LogSection::LogSection((LogSection *)&submitInfoReset,(string *)&resultsBuffer,&local_218);
  tcu::TestLog::startSection
            (this_00,(char *)submitInfoReset._0_8_,(char *)submitInfoReset.pWaitDstStageMask);
  if ((VkCommandBuffer **)submitInfoReset.pWaitDstStageMask != &submitInfoReset.pCommandBuffers) {
    operator_delete(submitInfoReset.pWaitDstStageMask,(long)submitInfoReset.pCommandBuffers + 1);
  }
  if ((deUint32 *)submitInfoReset._0_8_ != &submitInfoReset.waitSemaphoreCount) {
    operator_delete((void *)submitInfoReset._0_8_,submitInfoReset._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != &local_218.field_2) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
  }
  if ((pointer *)
      resultsBuffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != ppuVar1) {
    operator_delete(resultsBuffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (ulong)(resultsBuffer.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage + 1));
  }
  pTVar10 = ((this->super_TestInstance).m_context)->m_testCtx->m_log;
  ppvVar2 = &submitInfoReset.pNext;
  ppvVar3 = &submitInfoReset.pNext;
  lVar18 = 0;
  do {
    submitInfoReset._0_8_ = pTVar10;
    if ((this->m_testVector).queryResultsAvailability == false) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)ppvVar2);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)ppvVar2,"query[ slot == ",0xf);
      std::ostream::operator<<(ppvVar2,(int)lVar18);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)ppvVar2,"] result == ",0xc);
      std::ostream::_M_insert<unsigned_long>((ulong)ppvVar2);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&submitInfoReset,(EndMessageToken *)&tcu::TestLog::EndMessage);
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)ppvVar3);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)ppvVar3,"query[ slot == ",0xf);
      std::ostream::operator<<(ppvVar3,(int)lVar18);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)ppvVar3,"] result == ",0xc);
      std::ostream::_M_insert<unsigned_long>((ulong)ppvVar3);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)ppvVar3,", availability\t== ",0x12);
      std::ostream::_M_insert<unsigned_long>((ulong)ppvVar3);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&submitInfoReset,(EndMessageToken *)&tcu::TestLog::EndMessage);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&submitInfoReset.pNext);
    std::ios_base::~ios_base(local_150);
    lVar18 = lVar18 + 1;
  } while (lVar18 != 3);
  VVar7 = (this->m_testVector).primitiveTopology;
  pTVar10 = ((this->super_TestInstance).m_context)->m_testCtx->m_log;
  ppvVar2 = &submitInfoReset.pNext;
  bVar12 = true;
  lVar18 = 0;
  do {
    iVar21 = (int)lVar18;
    if (((this->m_testVector).queryResultsAvailability == true) && (queryAvailability[lVar18] == 0))
    {
      if (OVar5 == WAIT_NONE) {
LAB_006a4752:
        uVar17 = 0;
        uVar22 = 0;
        goto LAB_006a4764;
      }
      submitInfoReset._0_8_ = pTVar10;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&submitInfoReset.pNext);
      ppvVar3 = &submitInfoReset.pNext;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)ppvVar3,"query results availability was 0 for index ",0x2b);
      std::ostream::operator<<(ppvVar3,iVar21);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)ppvVar3,", expected any value greater than 0.",0x24);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&submitInfoReset,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)ppvVar3);
      std::ios_base::~ios_base(local_150);
LAB_006a49ce:
      bVar12 = false;
    }
    else {
      if (VVar7 == VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST) {
        uVar17 = 0x7c2;
        if (lVar18 == 2) {
          uVar17 = 0;
        }
        uVar22 = 0x83d;
        if (lVar18 == 2) {
          uVar22 = 0;
        }
      }
      else {
        if (VVar7 != VK_PRIMITIVE_TOPOLOGY_POINT_LIST) {
          pTVar16 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (pTVar16,"Unsupported primitive topology",(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/query_pool/vktQueryPoolOcclusionTests.cpp"
                     ,0x3f4);
          __cxa_throw(pTVar16,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
        }
        if (iVar21 == 0) {
          uVar17 = 3;
          uVar22 = 3;
        }
        else {
          if (iVar21 != 1) goto LAB_006a4752;
          uVar17 = 1;
          uVar22 = 1;
        }
      }
LAB_006a4764:
      uVar11 = queryResults[lVar18];
      if ((uVar22 == 0 && uVar17 == 0) || (((this->m_testVector).queryControlFlags & 1) != 0)) {
        if (uVar11 < uVar17 || uVar22 < uVar11) {
          submitInfoReset._0_8_ = pTVar10;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)ppvVar2);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)ppvVar2,"wrong value of query for index ",0x1f);
          std::ostream::operator<<(ppvVar2,iVar21);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)ppvVar2,", expected the value minimum of ",0x20);
          std::ostream::_M_insert<unsigned_long>((ulong)ppvVar2);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)ppvVar2,", maximum of ",0xd)
          ;
          std::ostream::_M_insert<unsigned_long>((ulong)ppvVar2);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)ppvVar2," got ",5);
          std::ostream::_M_insert<unsigned_long>((ulong)ppvVar2);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)ppvVar2,".",1);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)&submitInfoReset,(EndMessageToken *)&tcu::TestLog::EndMessage
                    );
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)ppvVar2);
          std::ios_base::~ios_base(local_150);
          goto LAB_006a49ce;
        }
      }
      else if (uVar11 == 0) {
        submitInfoReset._0_8_ = pTVar10;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&submitInfoReset.pNext);
        ppvVar3 = &submitInfoReset.pNext;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)ppvVar3,"wrong value of query for index ",0x1f);
        std::ostream::operator<<(ppvVar3,iVar21);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)ppvVar3,", expected any non-zero value, got ",0x23);
        std::ostream::_M_insert<unsigned_long>((ulong)ppvVar3);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)ppvVar3,".",1);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)&submitInfoReset,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)ppvVar3);
        std::ios_base::~ios_base(local_150);
        bVar12 = false;
      }
    }
    lVar18 = lVar18 + 1;
    if (lVar18 == 3) {
      tcu::TestLog::endSection(this_00);
      if ((this->m_testVector).queryResultsMode != RESULTS_MODE_COPY) {
        VVar13 = (*vk->_vptr_DeviceInterface[3])(vk,pVVar15);
        ::vk::checkResult(VVar13,"vk.queueWaitIdle(queue)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/query_pool/vktQueryPoolOcclusionTests.cpp"
                          ,0x2d9);
      }
      pdVar4 = &submitInfoReset.waitSemaphoreCount;
      submitInfoReset._0_8_ = pdVar4;
      if (bVar12) {
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&submitInfoReset,"Query result verification passed","");
        __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
        (__return_storage_ptr__->m_description)._M_dataplus._M_p =
             (pointer)&(__return_storage_ptr__->m_description).field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&__return_storage_ptr__->m_description,submitInfoReset._0_8_,
                   (long)submitInfoReset.pNext + submitInfoReset._0_8_);
      }
      else {
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&submitInfoReset,"Query result verification failed","");
        __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
        (__return_storage_ptr__->m_description)._M_dataplus._M_p =
             (pointer)&(__return_storage_ptr__->m_description).field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&__return_storage_ptr__->m_description,submitInfoReset._0_8_,
                   (long)submitInfoReset.pNext + submitInfoReset._0_8_);
      }
      if ((deUint32 *)submitInfoReset._0_8_ != pdVar4) {
        operator_delete((void *)submitInfoReset._0_8_,submitInfoReset._16_8_ + 1);
      }
      if (local_1e0.
          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl
          .super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_1e0.
                        super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_1e0.
                              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_1e0.
                              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

tcu::TestStatus OcclusionQueryTestInstance::iterate (void)
{
	const vk::VkQueue			queue		= m_context.getUniversalQueue();
	const vk::DeviceInterface&	vk			= m_context.getDeviceInterface();
	tcu::TestLog&				log			= m_context.getTestContext().getLog();
	std::vector<tcu::Vec4>		vertices	(NUM_VERTICES);

	// 1st triangle
	vertices[START_VERTEX + 0] = tcu::Vec4( 0.5,  0.5, 0.5, 1.0);
	vertices[START_VERTEX + 1] = tcu::Vec4( 0.5, -0.5, 0.5, 1.0);
	vertices[START_VERTEX + 2] = tcu::Vec4(-0.5,  0.5, 0.5, 1.0);
	// 2nd triangle - partially occluding the scene
	vertices[START_VERTEX_PARTIALLY_OCCLUDED + 0] = tcu::Vec4(-0.5, -0.5, 1.0, 1.0);
	vertices[START_VERTEX_PARTIALLY_OCCLUDED + 1] = tcu::Vec4( 0.5, -0.5, 1.0, 1.0);
	vertices[START_VERTEX_PARTIALLY_OCCLUDED + 2] = tcu::Vec4(-0.5,  0.5, 1.0, 1.0);
	// 3nd triangle - fully occluding the scene
	vertices[START_VERTEX_OCCLUDER + 0] = tcu::Vec4( 0.5,  0.5, 1.0, 1.0);
	vertices[START_VERTEX_OCCLUDER + 1] = tcu::Vec4( 0.5, -0.5, 1.0, 1.0);
	vertices[START_VERTEX_OCCLUDER + 2] = tcu::Vec4(-0.5,  0.5, 1.0, 1.0);

	m_stateObjects->setVertices(vk, vertices);

	if (hasSeparateResetCmdBuf())
	{
		const vk::VkSubmitInfo		submitInfoReset =
		{
			vk::VK_STRUCTURE_TYPE_SUBMIT_INFO,			// VkStructureType			sType;
			DE_NULL,									// const void*				pNext;
			0u,											// deUint32					waitSemaphoreCount;
			DE_NULL,									// const VkSemaphore*		pWaitSemaphores;
			(const vk::VkPipelineStageFlags*)DE_NULL,
			1u,											// deUint32					commandBufferCount;
			&m_queryPoolResetCommandBuffer.get(),		// const VkCommandBuffer*	pCommandBuffers;
			0u,											// deUint32					signalSemaphoreCount;
			DE_NULL										// const VkSemaphore*		pSignalSemaphores;
		};

		vk.queueSubmit(queue, 1, &submitInfoReset, DE_NULL);

		// Trivially wait for reset to complete. This is to ensure the query pool is in reset state before
		// host accesses, so as to not insert any synchronization before capturing the results needed for WAIT_NONE
		// variant of test.
		VK_CHECK(vk.queueWaitIdle(queue));
	}

	{
		const vk::VkSubmitInfo submitInfoRender =
		{
			vk::VK_STRUCTURE_TYPE_SUBMIT_INFO,	// VkStructureType			sType;
			DE_NULL,							// const void*				pNext;
			0,									// deUint32					waitSemaphoreCount;
			DE_NULL,							// const VkSemaphore*		pWaitSemaphores;
			(const vk::VkPipelineStageFlags*)DE_NULL,
			1,									// deUint32					commandBufferCount;
			&m_renderCommandBuffer.get(),		// const VkCommandBuffer*	pCommandBuffers;
			0,									// deUint32					signalSemaphoreCount;
			DE_NULL								// const VkSemaphore*		pSignalSemaphores;
		};
		vk.queueSubmit(queue, 1, &submitInfoRender, DE_NULL);
	}

	if (m_testVector.queryWait == WAIT_QUEUE)
	{
		VK_CHECK(vk.queueWaitIdle(queue));
	}

	if (hasSeparateCopyCmdBuf())
	{
		// In case of WAIT_QUEUE test variant, the previously submitted m_renderCommandBuffer did not
		// contain vkCmdCopyQueryResults, so additional cmd buffer is needed.

		// In the case of WAIT_NONE or WAIT_QUERY, vkCmdCopyQueryResults is stored in m_renderCommandBuffer.

		const vk::VkSubmitInfo submitInfo =
		{
			vk::VK_STRUCTURE_TYPE_SUBMIT_INFO,	// VkStructureType			sType;
			DE_NULL,							// const void*				pNext;
			0,									// deUint32					waitSemaphoreCount;
			DE_NULL,							// const VkSemaphore*		pWaitSemaphores;
			(const vk::VkPipelineStageFlags*)DE_NULL,
			1,									// deUint32					commandBufferCount;
			&m_copyResultsCommandBuffer.get(),	// const VkCommandBuffer*	pCommandBuffers;
			0,									// deUint32					signalSemaphoreCount;
			DE_NULL								// const VkSemaphore*		pSignalSemaphores;
		};
		vk.queueSubmit(queue, 1, &submitInfo, DE_NULL);
	}

	if (m_testVector.queryResultsMode == RESULTS_MODE_COPY)
	{
		// In case of vkCmdCopyQueryResults is used, test must always wait for it
		// to complete before we can read the result buffer.

		VK_CHECK(vk.queueWaitIdle(queue));
	}

	deUint64 queryResults		[NUM_QUERIES_IN_POOL];
	deUint64 queryAvailability	[NUM_QUERIES_IN_POOL];

	// Allow not ready results only if nobody waited before getting the query results
	bool	allowNotReady		= (m_testVector.queryWait == WAIT_NONE);

	captureResults(queryResults, queryAvailability, allowNotReady);

	log << tcu::TestLog::Section("OcclusionQueryResults", "Occlusion query results");

	logResults(queryResults, queryAvailability);
	bool passed = validateResults(queryResults, queryAvailability, allowNotReady, m_testVector.primitiveTopology);

	log << tcu::TestLog::EndSection;

	if (m_testVector.queryResultsMode != RESULTS_MODE_COPY)
	{
		VK_CHECK(vk.queueWaitIdle(queue));
	}

		if (passed)
	{
		return tcu::TestStatus(QP_TEST_RESULT_PASS, "Query result verification passed");
	}
	return tcu::TestStatus(QP_TEST_RESULT_FAIL, "Query result verification failed");
}